

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_scanl.c
# Opt level: O3

void mgga_x_scanl_init(xc_func_type *p)

{
  int iVar1;
  void *pvVar2;
  int mgga_id;
  
  iVar1 = p->info->number;
  mgga_id = 0x107;
  if (iVar1 != 700) {
    if (iVar1 != 0x2bd) {
      mgga_x_scanl_init_cold_1();
      pvVar2 = malloc(0x40);
      p->params = pvVar2;
      iVar1 = p->info->number;
      if ((iVar1 != 0x11a) && (iVar1 != 0x117)) {
        return;
      }
      xc_hyb_init_hybrid(p,0.0);
      return;
    }
    mgga_id = 0x245;
  }
  xc_deorbitalize_init(p,mgga_id,0x27a);
  return;
}

Assistant:

static void
mgga_x_scanl_init(xc_func_type *p)
{
  switch(p->info->number){
  case(XC_MGGA_X_SCANL):
    xc_deorbitalize_init(p, XC_MGGA_X_SCAN, XC_MGGA_K_PC07_OPT);
    break;
  case(XC_MGGA_X_REVSCANL):
    xc_deorbitalize_init(p, XC_MGGA_X_REVSCAN, XC_MGGA_K_PC07_OPT);
    break;
  default:
    fprintf(stderr,"Internal error in mgga_x_scanl_init\n");
    exit(1);
  }
}